

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall kws::Parser::IsInUnion(Parser *this,size_t pos,char *buffer)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_RDX;
  ulong in_RSI;
  long in_RDI;
  undefined1 unaff_retaddr;
  size_t in_stack_00000008;
  char in_stack_00000016;
  char in_stack_00000017;
  Parser *in_stack_00000018;
  size_t c;
  size_t b;
  string buf;
  allocator local_81;
  string local_80 [32];
  size_t local_60;
  ulong local_58;
  undefined4 local_50;
  string local_40 [32];
  char *local_20;
  ulong local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar6;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40,(string *)(in_RDI + 0x518));
  if (local_20 != (char *)0x0) {
    std::__cxx11::string::operator=(local_40,local_20);
  }
  uVar1 = local_18;
  if ((local_18 == 0xffffffffffffffff) || (lVar2 = std::__cxx11::string::size(), lVar2 - 1U < uVar1)
     ) {
    bVar6 = 0;
  }
  else {
    local_58 = std::__cxx11::string::find((char *)local_40,0x1d8c4c);
    while (local_58 != 0xffffffffffffffff) {
      while ((uVar1 = local_58, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3 &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar4 != '{')))
      {
        local_58 = local_58 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"",&local_81);
      sVar5 = FindClosingChar(in_stack_00000018,in_stack_00000017,in_stack_00000016,
                              in_stack_00000008,(bool)unaff_retaddr,
                              (string *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      local_60 = sVar5;
      if ((local_18 < sVar5) && (local_58 < local_18)) {
        bVar6 = 1;
        goto LAB_001395c7;
      }
      local_58 = std::__cxx11::string::find((char *)local_40,0x1d8c4c);
    }
    bVar6 = 0;
  }
LAB_001395c7:
  local_50 = 1;
  std::__cxx11::string::~string(local_40);
  return (bool)(bVar6 & 1);
}

Assistant:

bool Parser::IsInUnion(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;
  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return false;
    }

  size_t b = buf.find("union",0);
  while(b!=std::string::npos)
    {
    while(b<buf.size())
      {
      if(buf[b] == '{')
        {
        break;
        }
      b++;
      }

    size_t c=this->FindClosingChar('{','}',b,true);
    if(pos<c && pos>b)
      {
      return true;
      }
    b = buf.find("union",b+1);
    }
  return false;
}